

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O1

void ImGui::NavInitRequestApplyResult(void)

{
  ImGuiContext *pIVar1;
  
  pIVar1 = GImGui;
  if (GImGui->NavWindow != (ImGuiWindow *)0x0) {
    SetNavID(GImGui->NavInitResultId,GImGui->NavLayer,0,&GImGui->NavInitResultRectRel);
    pIVar1->NavIdIsAlive = true;
    if (pIVar1->NavInitRequestFromMove == true) {
      pIVar1->NavMousePosDirty = true;
      pIVar1->NavDisableHighlight = false;
      pIVar1->NavDisableMouseHover = true;
    }
  }
  return;
}

Assistant:

void ImGui::NavInitRequestApplyResult()
{
    // In very rare cases g.NavWindow may be null (e.g. clearing focus after requesting an init request, which does happen when releasing Alt while clicking on void)
    ImGuiContext& g = *GImGui;
    if (!g.NavWindow)
        return;

    // Apply result from previous navigation init request (will typically select the first item, unless SetItemDefaultFocus() has been called)
    // FIXME-NAV: On _NavFlattened windows, g.NavWindow will only be updated during subsequent frame. Not a problem currently.
    IMGUI_DEBUG_LOG_NAV("[nav] NavInitRequest: result NavID 0x%08X in Layer %d Window \"%s\"\n", g.NavInitResultId, g.NavLayer, g.NavWindow->Name);
    SetNavID(g.NavInitResultId, g.NavLayer, 0, g.NavInitResultRectRel);
    g.NavIdIsAlive = true; // Mark as alive from previous frame as we got a result
    if (g.NavInitRequestFromMove)
    {
        g.NavDisableHighlight = false;
        g.NavDisableMouseHover = g.NavMousePosDirty = true;
    }
}